

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# irrString.h
# Opt level: O2

void __thiscall irr::core::string<char>::string(string<char> *this,unsigned_long number)

{
  string local_30;
  
  (this->str)._M_dataplus._M_p = (pointer)&(this->str).field_2;
  (this->str)._M_string_length = 0;
  (this->str).field_2._M_local_buf[0] = '\0';
  ::std::__cxx11::to_string(&local_30,number);
  ::std::__cxx11::string::operator=((string *)this,(string *)&local_30);
  ::std::__cxx11::string::_M_dispose();
  return;
}

Assistant:

explicit string(unsigned long number)
	{
		str = std::to_string(number);
	}